

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralPointAction::~IfcStructuralPointAction
          (IfcStructuralPointAction *this)

{
  undefined1 *this_00;
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  this_00 = &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.
             super_IfcObject.field_0x28;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x28 = 0x9ac340;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x10 = 0x9ac430;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x18 = 0x9ac368;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0xc0 = 0x9ac390;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.Representation.
    have = 0x9ac3b8;
  this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.GlobalOrLocal.field_2.
  _M_allocated_capacity = 0x9ac3e0;
  *(undefined8 *)&this[-1].super_IfcStructuralAction.field_0x160 = 0x9ac408;
  puVar1 = *(undefined1 **)&this[-1].super_IfcStructuralAction.CausedBy.have;
  puVar2 = &this[-1].super_IfcStructuralAction.field_0x180;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  IfcStructuralActivity::~IfcStructuralActivity
            ((IfcStructuralActivity *)this_00,&PTR_construction_vtable_24__009ac1b0);
  operator_delete(this_00,0x1a0);
  return;
}

Assistant:

IfcStructuralPointAction() : Object("IfcStructuralPointAction") {}